

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_hash.c
# Opt level: O2

LY_ERR lyd_hash(lyd_node *node)

{
  uint16_t uVar1;
  long lVar2;
  uint32_t uVar3;
  size_t sVar4;
  char *pcVar5;
  lyd_node_inner *list;
  lyd_node_term *key;
  lyd_node *plVar6;
  ly_bool dyn;
  size_t key_len;
  
  if (node->schema != (lysc_node *)0x0) {
    pcVar5 = node->schema->module->name;
    sVar4 = strlen(pcVar5);
    uVar3 = lyht_hash_multi(0,pcVar5,sVar4);
    node->hash = uVar3;
    pcVar5 = node->schema->name;
    sVar4 = strlen(pcVar5);
    uVar3 = lyht_hash_multi(uVar3,pcVar5,sVar4);
    node->hash = uVar3;
    uVar1 = node->schema->nodetype;
    if (uVar1 == 8) {
      pcVar5 = (char *)(*(code *)(node[1].schema)->parent->name)(0,node + 1,5,0,&dyn,&key_len);
      uVar3 = lyht_hash_multi(node->hash,pcVar5,key_len);
      node->hash = uVar3;
      if (dyn != '\0') {
        free(pcVar5);
      }
    }
    else if (uVar1 == 0x10) {
      if ((node->schema->flags & 0x200) == 0) {
        plVar6 = node + 1;
        while (((lVar2 = *(long *)plVar6, lVar2 != 0 && (*(long *)(lVar2 + 8) != 0)) &&
               ((*(byte *)(*(long *)(lVar2 + 8) + 3) & 1) != 0))) {
          pcVar5 = (char *)(**(code **)(*(long *)(*(long *)(lVar2 + 0x40) + 0x10) + 0x28))
                                     (0,lVar2 + 0x38,5,0,&dyn,&key_len);
          uVar3 = lyht_hash_multi(node->hash,pcVar5,key_len);
          node->hash = uVar3;
          if (dyn != '\0') {
            free(pcVar5);
          }
          plVar6 = (lyd_node *)(lVar2 + 0x18);
        }
      }
      else {
        uVar3 = lyht_hash_multi(uVar3,(char *)0x0,0);
        node->hash = uVar3;
      }
    }
    uVar3 = lyht_hash_multi(node->hash,(char *)0x0,0);
    node->hash = uVar3;
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_hash(struct lyd_node *node)
{
    struct lyd_node *iter;
    const void *hash_key;
    ly_bool dyn;
    size_t key_len;

    if (!node->schema) {
        return LY_SUCCESS;
    }

    /* hash always starts with the module and schema name */
    node->hash = lyht_hash_multi(0, node->schema->module->name, strlen(node->schema->module->name));
    node->hash = lyht_hash_multi(node->hash, node->schema->name, strlen(node->schema->name));

    if (node->schema->nodetype == LYS_LIST) {
        if (node->schema->flags & LYS_KEYLESS) {
            /* key-less list simply calls hash function again with empty key,
             * just so that it differs from the first-instance hash
             */
            node->hash = lyht_hash_multi(node->hash, NULL, 0);
        } else {
            struct lyd_node_inner *list = (struct lyd_node_inner *)node;

            /* list hash is made up from its keys */
            for (iter = list->child; iter && iter->schema && (iter->schema->flags & LYS_KEY); iter = iter->next) {
                struct lyd_node_term *key = (struct lyd_node_term *)iter;

                hash_key = key->value.realtype->plugin->print(NULL, &key->value, LY_VALUE_LYB, NULL, &dyn, &key_len);
                node->hash = lyht_hash_multi(node->hash, hash_key, key_len);
                if (dyn) {
                    free((void *)hash_key);
                }
            }
        }
    } else if (node->schema->nodetype == LYS_LEAFLIST) {
        /* leaf-list adds its hash key */
        struct lyd_node_term *llist = (struct lyd_node_term *)node;

        hash_key = llist->value.realtype->plugin->print(NULL, &llist->value, LY_VALUE_LYB, NULL, &dyn, &key_len);
        node->hash = lyht_hash_multi(node->hash, hash_key, key_len);
        if (dyn) {
            free((void *)hash_key);
        }
    }

    /* finish the hash */
    node->hash = lyht_hash_multi(node->hash, NULL, 0);

    return LY_SUCCESS;
}